

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O0

void __thiscall
sznet::net::KcpTcpEventLoop::KcpTcpEventLoop
          (KcpTcpEventLoop *this,InetAddress udpLisetenAddr,string *name,int seed,int kcpMode)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  sz_sock sVar3;
  Timestamp TVar4;
  KcpTcpEventLoop *local_80;
  code *local_78;
  undefined8 local_70;
  type local_68;
  ReadEventCallback local_50;
  int local_20;
  int local_1c;
  int kcpMode_local;
  int seed_local;
  string *name_local;
  KcpTcpEventLoop *this_local;
  
  local_20 = kcpMode;
  local_1c = seed;
  _kcpMode_local = name;
  name_local = (string *)this;
  EventLoop::EventLoop(&this->super_EventLoop);
  (this->super_EventLoop)._vptr_EventLoop = (_func_int **)&PTR__KcpTcpEventLoop_001fe518;
  uVar1 = udpLisetenAddr.field_0.m_addr.sin_zero;
  *(undefined8 *)((long)&(this->m_udpLisetenAddr).field_0 + 0xc) = udpLisetenAddr.field_0._12_8_;
  *(undefined8 *)((long)&(this->m_udpLisetenAddr).field_0 + 0x14) = udpLisetenAddr.field_0._20_8_;
  *(undefined8 *)&(this->m_udpLisetenAddr).field_0 = udpLisetenAddr.field_0._0_8_;
  *(undefined8 *)((long)&(this->m_udpLisetenAddr).field_0 + 8) = uVar1;
  uVar2 = InetAddress::family(&udpLisetenAddr);
  sVar3 = sockets::sz_udp_createnonblockingordie((uint)uVar2);
  Socket::Socket(&this->m_udpSocket,sVar3,true);
  sVar3 = Socket::fd(&this->m_udpSocket);
  Channel::Channel(&this->m_udpChannel,&this->super_EventLoop,sVar3);
  Buffer::Buffer(&this->m_inputBuffer,4,0x400);
  Buffer::Buffer(&this->m_tmpBuffer,4,0x400);
  std::
  map<unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
  ::map(&this->m_tcpConnections);
  std::
  map<unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
  ::map(&this->m_kcpConnections);
  std::
  unordered_map<sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
  ::unordered_map(&this->m_addrConns);
  NetStatInfo::NetStatInfo(&this->m_netStatInfo);
  NetStatInfo::NetStatInfo(&this->m_prevNetStatInfo);
  TVar4 = Timestamp::now();
  (this->m_calcNetLastTime).m_microSecondsSinceEpoch = TVar4.m_microSecondsSinceEpoch;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->m_random,(long)local_1c);
  std::
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::map(&this->m_crypts);
  this->m_curConv = 0;
  std::shared_ptr<sznet::net::TcpConnection>::shared_ptr(&this->m_curTcpConn);
  std::shared_ptr<sznet::net::KcpConnection>::shared_ptr(&this->m_curKcpConn);
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::function
            (&this->m_kcpConnectionCallback);
  std::
  function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::function(&this->m_kcpMessageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::function
            (&this->m_kcpWriteCompleteCallback);
  this->m_kcpMode = local_20;
  Socket::bindAddress(&this->m_udpSocket,&this->m_udpLisetenAddr);
  Channel::enableReading(&this->m_udpChannel);
  local_78 = handleUdpRead;
  local_70 = 0;
  local_80 = this;
  std::
  bind<void(sznet::net::KcpTcpEventLoop::*)(sznet::Timestamp),sznet::net::KcpTcpEventLoop*,std::_Placeholder<1>const&>
            (&local_68,(offset_in_KcpTcpEventLoop_to_subr *)&local_78,&local_80,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(sznet::Timestamp)>::
  function<std::_Bind<void(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop*,std::_Placeholder<1>))(sznet::Timestamp)>,void>
            ((function<void(sznet::Timestamp)> *)&local_50,&local_68);
  Channel::setReadCallback(&this->m_udpChannel,&local_50);
  std::function<void_(sznet::Timestamp)>::~function(&local_50);
  return;
}

Assistant:

KcpTcpEventLoop::KcpTcpEventLoop(const InetAddress udpLisetenAddr, string name, int seed, int kcpMode) :
	EventLoop(),
	m_udpLisetenAddr(udpLisetenAddr),
	m_udpSocket(sockets::sz_udp_createnonblockingordie(udpLisetenAddr.family())),
	m_udpChannel(this, m_udpSocket.fd()),
	m_calcNetLastTime(Timestamp::now()),
	m_random(seed),
	m_curConv(0),
	m_name(name),
	m_kcpMode(kcpMode)
{
	m_udpSocket.bindAddress(m_udpLisetenAddr);
	m_udpChannel.enableReading();
	m_udpChannel.setReadCallback(std::bind(&KcpTcpEventLoop::handleUdpRead, this, std::placeholders::_1));
}